

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

longlong QUtil::string_to_ll(char *str)

{
  int *piVar1;
  longlong lVar2;
  range_error *this;
  long *plVar3;
  long *plVar4;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = strtoll(str,(char **)0x0,10);
  if (*piVar1 != 0x22) {
    return lVar2;
  }
  this = (range_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"overflow/underflow converting ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_90);
  local_70 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_70 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar3[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
  }
  local_68 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_50 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::range_error::range_error(this,(string *)&local_50);
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

long long
QUtil::string_to_ll(char const* str)
{
    errno = 0;
#ifdef _MSC_VER
    long long result = _strtoi64(str, 0, 10);
#else
    long long result = strtoll(str, nullptr, 10);
#endif
    if (errno == ERANGE) {
        throw std::range_error(
            std::string("overflow/underflow converting ") + str + " to 64-bit integer");
    }
    return result;
}